

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<float>::default_cost_type
          (default_cost_type<float> *this,default_cost_type<float> *other,int n)

{
  float *__s;
  ulong __n;
  
  __n = 0xffffffffffffffff;
  if (-1 < n) {
    __n = (ulong)(uint)n * 4;
  }
  this->obj = other->obj;
  __s = (float *)operator_new__(__n);
  memset(__s,0,__n);
  (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
  if (0 < n) {
    memmove(__s,(other->linear_elements)._M_t.
                super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                super__Head_base<0UL,_float_*,_false>._M_head_impl,(ulong)(uint)n << 2);
    return;
  }
  return;
}

Assistant:

default_cost_type(const default_cost_type& other, int n)
      : obj(other.obj)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        std::copy_n(other.linear_elements.get(), n, linear_elements.get());
    }